

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap_client.cpp
# Opt level: O2

void __thiscall
zmq::zap_client_t::send_zap_request
          (zap_client_t *this,char *mechanism_,size_t mechanism_length_,uint8_t **credentials_,
          size_t *credentials_sizes_,size_t credentials_count_)

{
  int iVar1;
  undefined2 *puVar2;
  undefined1 *puVar3;
  void *pvVar4;
  int *piVar5;
  char *pcVar6;
  size_t i;
  ulong uVar7;
  msg_t msg;
  
  iVar1 = msg_t::init(&msg,(EVP_PKEY_CTX *)mechanism_);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x4b);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  msg_t::set_flags(&msg,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &msg);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x4e);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  iVar1 = msg_t::init_size(&msg,3);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x52);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  puVar2 = (undefined2 *)msg_t::data(&msg);
  *puVar2 = 0x2e31;
  *(undefined1 *)(puVar2 + 1) = 0x30;
  msg_t::set_flags(&msg,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &msg);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x56);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  iVar1 = msg_t::init_size(&msg,1);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x5a);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  puVar3 = (undefined1 *)msg_t::data(&msg);
  *puVar3 = 0x31;
  msg_t::set_flags(&msg,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &msg);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x5e);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  iVar1 = msg_t::init_size(&msg,*(size_t *)(&this->field_0x2a8 + (long)this->_vptr_zap_client_t[-3])
                          );
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x62);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  pvVar4 = msg_t::data(&msg);
  memcpy(pvVar4,*(void **)(&this->field_0x2a0 + (long)this->_vptr_zap_client_t[-3]),
         *(size_t *)(&this->field_0x2a8 + (long)this->_vptr_zap_client_t[-3]));
  msg_t::set_flags(&msg,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &msg);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x67);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  iVar1 = msg_t::init_size(&msg,(this->peer_address)._M_string_length);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x6b);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  pvVar4 = msg_t::data(&msg);
  memcpy(pvVar4,(this->peer_address)._M_dataplus._M_p,(this->peer_address)._M_string_length);
  msg_t::set_flags(&msg,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &msg);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x6f);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  iVar1 = msg_t::init_size(&msg,(ulong)(byte)(this->_vptr_zap_client_t[-3] + 0x10)
                                             [(long)&(this->peer_address)._M_dataplus]);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x73);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  pvVar4 = msg_t::data(&msg);
  memcpy(pvVar4,this->_vptr_zap_client_t[-3] + 0x11 + (long)&(this->peer_address)._M_dataplus,
         (ulong)(byte)(this->_vptr_zap_client_t[-3] + 0x10)[(long)&(this->peer_address)._M_dataplus]
        );
  msg_t::set_flags(&msg,'\x01');
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &msg);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x77);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  iVar1 = msg_t::init_size(&msg,mechanism_length_);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x7b);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  pvVar4 = msg_t::data(&msg);
  memcpy(pvVar4,mechanism_,mechanism_length_);
  if (credentials_count_ != 0) {
    msg_t::set_flags(&msg,'\x01');
  }
  iVar1 = session_base_t::write_zap_msg
                    (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3]),
                     &msg);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x80);
    fflush(_stderr);
    zmq_abort(pcVar6);
  }
  for (uVar7 = 0; credentials_count_ != uVar7; uVar7 = uVar7 + 1) {
    iVar1 = msg_t::init_size(&msg,credentials_sizes_[uVar7]);
    if (iVar1 != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
              ,0x85);
      fflush(_stderr);
      zmq_abort(pcVar6);
    }
    if (uVar7 < credentials_count_ - 1) {
      msg_t::set_flags(&msg,'\x01');
    }
    pvVar4 = msg_t::data(&msg);
    memcpy(pvVar4,credentials_[uVar7],credentials_sizes_[uVar7]);
    iVar1 = session_base_t::write_zap_msg
                      (*(session_base_t **)(&this->field_0x590 + (long)this->_vptr_zap_client_t[-3])
                       ,&msg);
    if (iVar1 != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
              ,0x8a);
      fflush(_stderr);
      zmq_abort(pcVar6);
    }
  }
  return;
}

Assistant:

void zap_client_t::send_zap_request (const char *mechanism_,
                                     size_t mechanism_length_,
                                     const uint8_t **credentials_,
                                     size_t *credentials_sizes_,
                                     size_t credentials_count_)
{
    // write_zap_msg cannot fail. It could only fail if the HWM was exceeded,
    // but on the ZAP socket, the HWM is disabled.

    int rc;
    msg_t msg;

    //  Address delimiter frame
    rc = msg.init ();
    errno_assert (rc == 0);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Version frame
    rc = msg.init_size (zap_version_len);
    errno_assert (rc == 0);
    memcpy (msg.data (), zap_version, zap_version_len);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Request ID frame
    rc = msg.init_size (id_len);
    errno_assert (rc == 0);
    memcpy (msg.data (), id, id_len);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Domain frame
    rc = msg.init_size (options.zap_domain.length ());
    errno_assert (rc == 0);
    memcpy (msg.data (), options.zap_domain.c_str (),
            options.zap_domain.length ());
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Address frame
    rc = msg.init_size (peer_address.length ());
    errno_assert (rc == 0);
    memcpy (msg.data (), peer_address.c_str (), peer_address.length ());
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Routing id frame
    rc = msg.init_size (options.routing_id_size);
    errno_assert (rc == 0);
    memcpy (msg.data (), options.routing_id, options.routing_id_size);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Mechanism frame
    rc = msg.init_size (mechanism_length_);
    errno_assert (rc == 0);
    memcpy (msg.data (), mechanism_, mechanism_length_);
    if (credentials_count_)
        msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Credentials frames
    for (size_t i = 0; i < credentials_count_; ++i) {
        rc = msg.init_size (credentials_sizes_[i]);
        errno_assert (rc == 0);
        if (i < credentials_count_ - 1)
            msg.set_flags (msg_t::more);
        memcpy (msg.data (), credentials_[i], credentials_sizes_[i]);
        rc = session->write_zap_msg (&msg);
        errno_assert (rc == 0);
    }
}